

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O3

TestStatus *
vkt::pipeline::anon_unknown_0::testNoAtt
          (TestStatus *__return_storage_ptr__,Context *context,bool multisample)

{
  int *piVar1;
  undefined1 *puVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  VkDeviceSize obj;
  VkDeviceSize VVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  TestStatus *pTVar10;
  VkCommandBuffer commandBuffer;
  bool bVar11;
  deUint32 queueFamilyIndex;
  int iVar12;
  VkResult result;
  int iVar13;
  VkPhysicalDeviceFeatures *pVVar14;
  anon_unknown_0 *this;
  VkDevice device;
  Allocator *allocator;
  const_iterator cVar15;
  TextureFormat format_00;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  deUint64 *pdVar16;
  NotSupportedError *this_03;
  VkDeviceSize bufferSize;
  int z;
  ulong uVar17;
  int y;
  undefined1 multisample_00;
  VkBufferCreateInfo bufferCreateInfo;
  uint uStack_384;
  VkDeviceSize vertexBufferOffset;
  undefined1 auStack_360 [24];
  undefined1 *local_348;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  deUint32 dStack_338;
  undefined4 uStack_334;
  VkSubpassDependency *pVStack_330;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VkBuffer local_2c8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_2c0;
  ulong local_2a8;
  Context *local_2a0;
  Move<vk::Handle<(vk::HandleType)18>_> local_298;
  UVec4 local_278;
  long local_268 [2];
  Move<vk::Handle<(vk::HandleType)9>_> local_258;
  VkPipelineLayout local_238;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_230;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1f0;
  TestStatus *local_1d8;
  ulong local_1d0;
  VkQueue local_1c8;
  TextureFormat format;
  Move<vk::Handle<(vk::HandleType)22>_> local_1b8;
  VkCommandBuffer local_198;
  long *plStack_190;
  VkBufferCreateFlags local_188;
  undefined4 uStack_184;
  undefined8 uStack_180;
  VkPipelineLayout local_178;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_170;
  VkRenderPass local_158;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_150;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined4 local_108;
  VkCommandPool local_f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_f0;
  VkShaderModule local_d8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_d0;
  Move<vk::Handle<(vk::HandleType)19>_> local_b8;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_98;
  VkDescriptorImageInfo descriptorImageInfo;
  Move<vk::Handle<(vk::HandleType)21>_> local_70;
  Move<vk::Handle<(vk::HandleType)13>_> local_50;
  
  local_1d8 = __return_storage_ptr__;
  pVVar14 = Context::getDeviceFeatures(context);
  if (pVVar14->fragmentStoresAndAtomics != 0) {
    this = (anon_unknown_0 *)Context::getDeviceInterface(context);
    device = Context::getDevice(context);
    local_1c8 = Context::getUniversalQueue(context);
    queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
    allocator = Context::getDefaultAllocator(context);
    DStack_2c0.m_device = (VkDevice)0x0;
    DStack_2c0.m_allocator = (VkAllocationCallbacks *)0x0;
    local_2c8.m_internal = 0;
    DStack_2c0.m_deviceIface = (DeviceInterface *)0x0;
    p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)context->m_progCollection;
    puVar2 = auStack_360 + 8;
    vertexBufferOffset = (VkDeviceSize)puVar2;
    local_2a0 = context;
    std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBufferOffset,"vert","");
    cVar15 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var3,(key_type *)&vertexBufferOffset);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,(DeviceInterface *)this,
               device,*(ProgramBinary **)(cVar15._M_node + 2),0);
    DStack_150.m_device = (VkDevice)bufferCreateInfo._16_8_;
    local_158.m_internal = bufferCreateInfo._0_8_;
    DStack_150.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bufferCreateInfo._4_4_ = 0;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo.flags = 0;
    bufferCreateInfo._20_4_ = 0;
    bufferCreateInfo.size._0_4_ = 0;
    bufferCreateInfo.size._4_4_ = 0;
    if ((undefined1 *)vertexBufferOffset != puVar2) {
      operator_delete((void *)vertexBufferOffset,auStack_360._8_8_ + 1);
    }
    p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              *)local_2a0->m_progCollection;
    vertexBufferOffset = (VkDeviceSize)puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBufferOffset,"frag","");
    cVar15 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             ::find(p_Var3,(key_type *)&vertexBufferOffset);
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,(DeviceInterface *)this,
               device,*(ProgramBinary **)(cVar15._M_node + 2),0);
    DStack_d0.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
    DStack_d0.m_device = (VkDevice)bufferCreateInfo._16_8_;
    local_d8.m_internal = bufferCreateInfo._0_8_;
    DStack_d0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bufferCreateInfo._4_4_ = 0;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo.flags = 0;
    bufferCreateInfo._20_4_ = 0;
    bufferCreateInfo.size._0_4_ = 0;
    bufferCreateInfo.size._4_4_ = 0;
    if ((undefined1 *)vertexBufferOffset != puVar2) {
      operator_delete((void *)vertexBufferOffset,auStack_360._8_8_ + 1);
    }
    bufferCreateInfo.usage = (uint)multisample + (uint)multisample * 2 + 1;
    local_2a8 = (ulong)bufferCreateInfo.usage;
    uVar17 = local_2a8 << 0x20;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo.flags = 0;
    bufferCreateInfo._20_4_ = 1;
    bufferCreateInfo.size._0_4_ = 0x25;
    bufferCreateInfo.size._4_4_ = 4;
    bufferCreateInfo.sharingMode = VK_SHARING_MODE_CONCURRENT;
    bufferCreateInfo.queueFamilyIndexCount = 1;
    bufferCreateInfo._44_4_ = 1;
    bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
    bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
    ::vk::createImage(&local_258,(DeviceInterface *)this,device,
                      (VkImageCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
    bindImage(&local_98,(DeviceInterface *)this,device,allocator,
              (VkImage)local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                       m_internal,(MemoryRequirement)0x0);
    local_118 = 1;
    uStack_110 = 1;
    local_108 = 1;
    subresourceRange.levelCount = 1;
    subresourceRange.aspectMask = 1;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.baseArrayLayer = 0;
    subresourceRange.layerCount = 1;
    makeImageView(&local_50,(DeviceInterface *)this,device,
                  (VkImage)local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                           m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                  subresourceRange);
    format_00 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    iVar12 = tcu::getPixelSize(format_00);
    makeBufferCreateInfo(&bufferCreateInfo,(long)(iVar12 << ((multisample & 7U) << 2 | 2)),2);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,
                       (DeviceInterface *)this,device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0
                      );
    obj = vertexBufferOffset;
    DStack_1f0.m_deviceIface = (DeviceInterface *)auStack_360._0_8_;
    DStack_1f0.m_device = (VkDevice)auStack_360._8_8_;
    DStack_1f0.m_allocator = (VkAllocationCallbacks *)auStack_360._16_8_;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
               (DeviceInterface *)this,device,allocator,(VkBuffer)vertexBufferOffset,
               (MemoryRequirement)0x1);
    uVar5 = bufferCreateInfo._0_8_;
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
              ((DescriptorSetLayoutBuilder *)&bufferCreateInfo);
    this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                        ((DescriptorSetLayoutBuilder *)&bufferCreateInfo,
                         VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x10,(VkSampler *)0x0);
    ::vk::DescriptorSetLayoutBuilder::build(&local_b8,this_00,(DeviceInterface *)this,device,0);
    pvVar4 = (void *)CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                              bufferCreateInfo.pQueueFamilyIndices._0_4_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,((ulong)uStack_384 << 0x20) - (long)pvVar4);
    }
    pvVar4 = (void *)CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount
                                     ) - (long)pvVar4);
    }
    if (bufferCreateInfo._0_8_ != 0) {
      operator_delete((void *)bufferCreateInfo._0_8_,
                      bufferCreateInfo._16_8_ - bufferCreateInfo._0_8_);
    }
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&bufferCreateInfo);
    this_01 = ::vk::DescriptorPoolBuilder::addType
                        ((DescriptorPoolBuilder *)&bufferCreateInfo,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE
                         ,1);
    ::vk::DescriptorPoolBuilder::build(&local_70,this_01,(DeviceInterface *)this,device,1,1);
    if (bufferCreateInfo._0_8_ != 0) {
      operator_delete((void *)bufferCreateInfo._0_8_,
                      bufferCreateInfo._16_8_ - bufferCreateInfo._0_8_);
    }
    makeDescriptorSet(&local_1b8,(DeviceInterface *)this,device,
                      (VkDescriptorPool)
                      local_70.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
                      m_internal,
                      (VkDescriptorSetLayout)
                      local_b8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                      m_internal);
    descriptorImageInfo.sampler.m_internal = 0;
    descriptorImageInfo.imageView.m_internal =
         local_50.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
    descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)&bufferCreateInfo);
    this_02 = (DescriptorSetUpdateBuilder *)
              ::vk::DescriptorSetUpdateBuilder::write
                        ((DescriptorSetUpdateBuilder *)&bufferCreateInfo,
                         (int)local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object
                              .m_internal,(void *)0x0,0);
    ::vk::DescriptorSetUpdateBuilder::update(this_02,(DeviceInterface *)this,device);
    pvVar4 = (void *)CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                              bufferCreateInfo.pQueueFamilyIndices._0_4_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,((ulong)uStack_384 << 0x20) - (long)pvVar4);
    }
    pvVar4 = (void *)CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount
                                     ) - (long)pvVar4);
    }
    std::
    vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
    ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
               *)&bufferCreateInfo);
    makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,
                       (DeviceInterface *)this,device,
                       (VkDescriptorSetLayout)
                       local_b8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
                       m_internal);
    DStack_170.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
    DStack_170.m_device = (VkDevice)bufferCreateInfo._16_8_;
    local_178.m_internal = bufferCreateInfo._0_8_;
    DStack_170.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
    pipeline.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pipeline.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pipeline.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    subpasses.
    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    subpasses.
    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    subpasses.
    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
    bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
    bufferCreateInfo.usage = 0;
    bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    bufferCreateInfo.queueFamilyIndexCount = 0;
    bufferCreateInfo._44_4_ = 0;
    bufferCreateInfo.flags = 0;
    bufferCreateInfo._20_4_ = 0;
    bufferCreateInfo.size._0_4_ = 0;
    bufferCreateInfo.size._4_4_ = 0;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bufferCreateInfo._4_4_ = 0;
    bufferCreateInfo.pNext = (void *)0x0;
    std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
    _M_realloc_insert<vk::VkSubpassDescription_const&>
              ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
               &subpasses,(iterator)0x0,(VkSubpassDescription *)&bufferCreateInfo);
    auStack_360._0_8_ = (DeviceInterface *)0x0;
    dStack_338 = 0;
    uStack_334 = 0;
    pVStack_330 = (VkSubpassDependency *)0x0;
    auStack_360._8_8_ = 0;
    auStack_360._16_8_ = 0;
    vertexBufferOffset = 0x26;
    local_348 = &DAT_00000001;
    uStack_340 = SUB84(subpasses.
                       super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                       ._M_impl.super__Vector_impl_data._M_start,0);
    uStack_33c = (undefined4)
                 ((ulong)subpasses.
                         super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    ::vk::createRenderPass
              ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertices,(DeviceInterface *)this,device,
               (VkRenderPassCreateInfo *)&vertexBufferOffset,(VkAllocationCallbacks *)0x0);
    if (subpasses.
        super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(subpasses.
                      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)subpasses.
                            super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)subpasses.
                            super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_238.m_internal =
         (deUint64)
         vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    DStack_230.m_deviceIface =
         (DeviceInterface *)
         vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    DStack_230.m_device =
         (VkDevice)
         vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    subpasses.
    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    subpasses.
    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    subpasses.
    super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ::vk::createCommandPool
              ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,(DeviceInterface *)this,
               device,2,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
    DStack_f0.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
    DStack_f0.m_device = (VkDevice)bufferCreateInfo._16_8_;
    local_f8.m_internal = bufferCreateInfo._0_8_;
    DStack_f0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
    makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,(DeviceInterface *)this,
                      device,(VkCommandPool)bufferCreateInfo._0_8_);
    uStack_180 = CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
    local_188 = bufferCreateInfo.flags;
    uStack_184 = bufferCreateInfo._20_4_;
    local_198 = (VkCommandBuffer)bufferCreateInfo._0_8_;
    plStack_190 = (long *)bufferCreateInfo.pNext;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bufferCreateInfo.sType = 0xbe800000;
    bufferCreateInfo._4_4_ = 0xbe800000;
    bufferCreateInfo.pNext = (void *)0x3f80000000000000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
               (Vector<float,_4> *)&bufferCreateInfo);
    bufferCreateInfo.sType = 0xbe800000;
    bufferCreateInfo._4_4_ = 0x3e800000;
    bufferCreateInfo.pNext = (void *)0x3f80000000000000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
               (Vector<float,_4> *)&bufferCreateInfo);
    bufferCreateInfo.sType = 0x3e800000;
    bufferCreateInfo._4_4_ = 0xbe800000;
    bufferCreateInfo.pNext = (void *)0x3f80000000000000;
    local_1d0 = uVar17 | 4;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
               (Vector<float,_4> *)&bufferCreateInfo);
    bufferCreateInfo.sType = 0x3e800000;
    bufferCreateInfo._4_4_ = 0x3e800000;
    bufferCreateInfo.pNext = (void *)0x3f80000000000000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
               (Vector<float,_4> *)&bufferCreateInfo);
    bufferSize = (long)vertices.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vertices.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    makeBufferCreateInfo(&bufferCreateInfo,bufferSize,0x80);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,
                       (DeviceInterface *)this,device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0
                      );
    uVar9 = auStack_360._16_8_;
    uVar8 = auStack_360._8_8_;
    uVar6 = auStack_360._0_8_;
    VVar7 = vertexBufferOffset;
    bufferCreateInfo._16_8_ = auStack_360._8_8_;
    bufferCreateInfo.size._0_4_ = (undefined4)auStack_360._16_8_;
    bufferCreateInfo.size._4_4_ = SUB84(auStack_360._16_8_,4);
    bufferCreateInfo._0_8_ = vertexBufferOffset;
    bufferCreateInfo.pNext = (void *)auStack_360._0_8_;
    vertexBufferOffset = 0;
    auStack_360._0_8_ = (pointer)0x0;
    auStack_360._8_8_ = (pointer)0x0;
    auStack_360._16_8_ = 0;
    if (local_2c8.m_internal == 0) {
      DStack_2c0.m_device = (VkDevice)uVar8;
      DStack_2c0.m_allocator = (VkAllocationCallbacks *)uVar9;
      local_2c8.m_internal = VVar7;
      DStack_2c0.m_deviceIface = (DeviceInterface *)uVar6;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_2c0,local_2c8);
      DStack_2c0.m_allocator =
           (VkAllocationCallbacks *)
           CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
      local_2c8.m_internal = bufferCreateInfo._0_8_;
      DStack_2c0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
      DStack_2c0.m_device = (VkDevice)bufferCreateInfo._16_8_;
      if (vertexBufferOffset != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)auStack_360,
                   (VkBuffer)vertexBufferOffset);
      }
    }
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
               (DeviceInterface *)this,device,allocator,local_2c8,(MemoryRequirement)0x1);
    uVar6 = bufferCreateInfo._0_8_;
    memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
           vertices.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start,bufferSize);
    multisample_00 = 0x7f;
    ::vk::flushMappedMemoryRange
              ((DeviceInterface *)this,device,(VkDeviceMemory)*(deUint64 *)(uVar6 + 8),
               *(VkDeviceSize *)(uVar6 + 0x10),bufferSize);
    if (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      multisample_00 = 0x9c;
      operator_delete(vertices.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vertices.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vertices.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    makeGraphicsPipeline
              (&local_298,this,(DeviceInterface *)device,(VkDevice)local_178.m_internal,local_238,
               local_158,local_d8,(VkShaderModule)0x20,(IVec3)ZEXT812(0x20),
               VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,multisample,(bool)multisample_00);
    uVar17 = local_1d0;
    pdVar16 = (deUint64 *)operator_new(0x20);
    pdVar16[2] = (deUint64)
                 local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    pdVar16[3] = (deUint64)
                 local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
    ;
    *pdVar16 = local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    pdVar16[1] = (deUint64)
                 local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                 m_deviceIface;
    local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
    local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo._0_8_ = pdVar16;
    bufferCreateInfo.pNext = operator_new(0x20);
    *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
    *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
    *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d24a90;
    *(deUint64 **)((long)bufferCreateInfo.pNext + 0x10) = pdVar16;
    *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
    *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                *)&pipeline,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
               &bufferCreateInfo);
    if (bufferCreateInfo.pNext != (void *)0x0) {
      LOCK();
      piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        bufferCreateInfo._4_4_ = 0;
        (**(code **)(*bufferCreateInfo.pNext + 0x10))();
      }
      LOCK();
      piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (bufferCreateInfo.pNext != (void *)0x0) {
          (**(code **)(*bufferCreateInfo.pNext + 8))();
        }
        bufferCreateInfo.pNext = (void *)0x0;
      }
    }
    if (local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
    local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
    local_298.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,
                    (DeviceInterface *)this,device,(VkRenderPass)local_238.m_internal,0,
                    (VkImageView *)0x0,0x20,0x20,1);
    uVar9 = auStack_360._8_8_;
    uVar8 = auStack_360._0_8_;
    VVar7 = vertexBufferOffset;
    bufferCreateInfo._16_8_ = auStack_360._8_8_;
    bufferCreateInfo.size._0_4_ = (undefined4)auStack_360._16_8_;
    bufferCreateInfo.size._4_4_ = SUB84(auStack_360._16_8_,4);
    bufferCreateInfo._0_8_ = vertexBufferOffset;
    bufferCreateInfo.pNext = (void *)auStack_360._0_8_;
    vertexBufferOffset = 0;
    auStack_360._0_8_ = (DeviceInterface *)0x0;
    auStack_360._8_8_ = 0;
    auStack_360._16_8_ = 0;
    if (subpasses.
        super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)uVar9;
      subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)VVar7;
      subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)uVar8;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
                 &subpasses.
                  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
                 (VkFramebuffer)
                 subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)bufferCreateInfo._0_8_;
      subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)bufferCreateInfo.pNext;
      subpasses.
      super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bufferCreateInfo._16_8_;
      if (vertexBufferOffset != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)23>_> *)auStack_360,
                   (VkFramebuffer)vertexBufferOffset);
      }
    }
    commandBuffer = local_198;
    beginCommandBuffer((DeviceInterface *)this,local_198);
    local_138 = 1;
    uStack_130 = 1;
    local_128 = 1;
    subresourceRange_00.levelCount = 1;
    subresourceRange_00.aspectMask = 1;
    subresourceRange_00.baseMipLevel = 0;
    subresourceRange_00.baseArrayLayer = 0;
    subresourceRange_00.layerCount = 1;
    makeImageMemoryBarrier
              ((VkImageMemoryBarrier *)&bufferCreateInfo,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
               VK_IMAGE_LAYOUT_GENERAL,
               (VkImage)local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal,subresourceRange_00);
    (**(code **)(*(long *)this + 0x368))
              (this,commandBuffer,1,0x80,0,0,0,0,0,1,(int)(VkImageMemoryBarrier *)&bufferCreateInfo)
    ;
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo._16_8_ = local_238.m_internal;
    bufferCreateInfo.size._0_4_ =
         SUB84(subpasses.
               super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
               ._M_impl.super__Vector_impl_data._M_start,0);
    bufferCreateInfo.size._4_4_ =
         (undefined4)
         ((ulong)subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    bufferCreateInfo.usage = 0;
    bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
    bufferCreateInfo.queueFamilyIndexCount = 0x20;
    bufferCreateInfo._44_4_ = 0x20;
    bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
    vertexBufferOffset = 0;
    (**(code **)(*(long *)this + 0x3a0))(this,commandBuffer,&bufferCreateInfo,0);
    (**(code **)(*(long *)this + 0x260))
              (this,commandBuffer,0,
               ((pipeline.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
               super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
    (**(code **)(*(long *)this + 0x2c0))(this,commandBuffer,0,1,&local_2c8,&vertexBufferOffset);
    (**(code **)(*(long *)this + 0x2b0))
              (this,commandBuffer,0,local_178.m_internal,0,1,(int)&local_1b8,0,0);
    (**(code **)(*(long *)this + 0x2c8))(this,commandBuffer,4,1,0,0);
    (**(code **)(*(long *)this + 0x3b0))(this,commandBuffer);
    bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    bufferCreateInfo.pNext = (void *)0x0;
    bufferCreateInfo.flags = 0x40;
    bufferCreateInfo._20_4_ = 0x800;
    bufferCreateInfo.size._0_4_ = 1;
    bufferCreateInfo.size._4_4_ = 6;
    bufferCreateInfo.usage = 0xffffffff;
    bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
    bufferCreateInfo.queueFamilyIndexCount =
         (deUint32)local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    bufferCreateInfo._44_4_ =
         SUB84(local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal >>
               0x20,0);
    bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
    bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
    (**(code **)(*(long *)this + 0x368))
              (this,commandBuffer,0x400,0x1000,0,0,0,0,0,1,(int)&bufferCreateInfo);
    vertexBufferOffset = 0;
    auStack_360._0_8_ = (DeviceInterface *)0x0;
    auStack_360._8_8_ = 1;
    auStack_360._16_8_ = 0x100000000;
    local_348 = (undefined1 *)0x0;
    uStack_340 = 0;
    uStack_33c = (undefined4)uVar17;
    dStack_338 = (deUint32)(uVar17 >> 0x20);
    uStack_334 = 1;
    (**(code **)(*(long *)this + 0x318))
              (this,commandBuffer,
               local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
               obj,1,(int)&vertexBufferOffset);
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(vertices.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000001000;
    (**(code **)(*(long *)this + 0x368))
              (this,commandBuffer,0x1000,0x4000,0,0,0,1,(int)&vertices,0,0);
    result = (**(code **)(*(long *)this + 0x250))(this,commandBuffer);
    ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineFramebufferAttachmentTests.cpp"
                      ,0x43e);
    submitCommandsAndWait((DeviceInterface *)this,device,local_1c8,commandBuffer);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)this,device,(VkDeviceMemory)*(deUint64 *)(uVar5 + 8),
               *(VkDeviceSize *)(uVar5 + 0x10),0xffffffffffffffff);
    format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&bufferCreateInfo,&format,4,(int)local_2a8,1);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&vertexBufferOffset,(TextureLevel *)&bufferCreateInfo);
    if (0 < (int)auStack_360._8_4_) {
      z = 0;
      iVar12 = auStack_360._8_4_;
      iVar13 = auStack_360._4_4_;
      do {
        if (0 < iVar13) {
          y = 0;
          iVar12 = auStack_360._0_4_;
          do {
            if (0 < iVar12) {
              iVar12 = 0;
              do {
                vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0000003f800000;
                vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f8000003e800000;
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&vertexBufferOffset,(Vec4 *)&vertices,iVar12,y,z);
                iVar12 = iVar12 + 1;
              } while (iVar12 < (int)auStack_360._0_4_);
              iVar13 = auStack_360._4_4_;
              iVar12 = auStack_360._0_4_;
            }
            y = y + 1;
          } while (y < iVar13);
          iVar12 = auStack_360._8_4_;
        }
        z = z + 1;
      } while (z < iVar12);
    }
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&vertices,&format,4,(int)local_2a8,1,
               *(void **)(uVar5 + 0x18));
    local_278.m_data._0_8_ = (long *)0x100000001;
    local_278.m_data[2] = 1;
    local_278.m_data[3] = 1;
    bVar11 = tcu::intThresholdCompare
                       (local_2a0->m_testCtx->m_log,"Image Comparison","",
                        (ConstPixelBufferAccess *)&vertexBufferOffset,
                        (ConstPixelBufferAccess *)&vertices,&local_278,COMPARE_LOG_RESULT);
    pTVar10 = local_1d8;
    if (bVar11) {
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&bufferCreateInfo);
      bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
      std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"Pass","");
      pTVar10->m_code = QP_TEST_RESULT_PASS;
      (pTVar10->m_description)._M_dataplus._M_p = (pointer)&(pTVar10->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar10->m_description,bufferCreateInfo._0_8_,
                 (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
      if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
        operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
      }
    }
    else {
      local_278.m_data._0_8_ = local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Fail","");
      pTVar10->m_code = QP_TEST_RESULT_FAIL;
      (pTVar10->m_description)._M_dataplus._M_p = (pointer)&(pTVar10->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar10->m_description,local_278.m_data._0_8_,
                 local_278.m_data._8_8_ + local_278.m_data._0_8_);
      if ((long *)local_278.m_data._0_8_ != local_268) {
        operator_delete((void *)local_278.m_data._0_8_,local_268[0] + 1);
      }
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&bufferCreateInfo);
    }
    if (commandBuffer != (VkCommandBuffer)0x0) {
      bufferCreateInfo._0_8_ = commandBuffer;
      (**(code **)(*plStack_190 + 0x240))(plStack_190,_local_188,uStack_180,1);
    }
    if (local_f8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_f0,local_f8);
    }
    if (subpasses.
        super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)
                 &subpasses.
                  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
                 (VkFramebuffer)
                 subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_238.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&DStack_230,(VkRenderPass)local_238.m_internal);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector(&pipeline);
    if (local_178.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_170,local_178);
    }
    if (local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
      bufferCreateInfo._0_8_ =
           local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
      (*(local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
        _vptr_DeviceInterface[0x3d])
                (local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                 m_deviceIface,
                 local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
                 local_1b8.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
                 m_internal,1);
    }
    if (local_70.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                (&local_70.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
                 (VkDescriptorPool)
                 local_70.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal);
    }
    if (local_b8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&local_b8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
                 (VkDescriptorSetLayout)
                 local_b8.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
    }
    if (uVar5 != 0) {
      (**(code **)(*(long *)uVar5 + 8))(uVar5);
    }
    if (obj != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&DStack_1f0,(VkBuffer)obj);
    }
    if (local_50.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                (&local_50.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
                 (VkImageView)
                 local_50.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
    }
    if (local_98.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
        (Allocation *)0x0) {
      (*(local_98.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
        ->_vptr_Allocation[1])();
    }
    if (local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 (VkImage)local_258.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                          m_internal);
    }
    if (local_d8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_d0,local_d8);
    }
    if (local_158.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                (&DStack_150,(VkShaderModule)local_158.m_internal);
    }
    if (uVar6 != 0) {
      (**(code **)(*(long *)uVar6 + 8))(uVar6);
    }
    if (local_2c8.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_2c0,local_2c8);
    }
    return pTVar10;
  }
  this_03 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&bufferCreateInfo,"fragmentStoresAndAtomics feature not supported","");
  tcu::NotSupportedError::NotSupportedError(this_03,(string *)&bufferCreateInfo);
  __cxa_throw(this_03,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus testNoAtt (Context& context, const bool multisample)
{
	const VkPhysicalDeviceFeatures		features				= context.getDeviceFeatures();
	if (!features.fragmentStoresAndAtomics)
		throw tcu::NotSupportedError("fragmentStoresAndAtomics feature not supported");

	const DeviceInterface&				vk						= context.getDeviceInterface();
	const VkDevice						device					= context.getDevice();
	const VkQueue						queue					= context.getUniversalQueue();
	const deUint32						queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	Allocator&							allocator				= context.getDefaultAllocator();
	const IVec3							renderSize				(32, 32, 1);

	Move<VkBuffer>						vertexBuffer;
	MovePtr<Allocation>					vertexBufferAlloc;

	const Unique<VkShaderModule>		vertexModule			(createShaderModule (vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>		fragmentModule			(createShaderModule (vk, device, context.getBinaryCollection().get("frag"), 0u));

	// Create image where we will record the writes. For single-sampled cases this is a 4x1 image
	// and for multi-sampled cases this is a 4x<num_samples> image.
	const deUint8						numSamples				= multisample ? 4 : 1;
	const deUint8						imageWidth				= 4;
	const deUint8						imageHeight				= numSamples;
	const deUint8						imageDepth				= 1;
	const deUint8						imageLayers				= 1;
	const IVec3							imageDim				= IVec3(imageWidth, imageHeight, imageDepth);
	const VkImageUsageFlags				imageUsage				= VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT;
	const Move<VkImage>					image					= makeImage(vk, device, VkImageViewCreateFlags(0), VK_IMAGE_TYPE_2D, COLOR_FORMAT, imageDim, imageLayers, imageUsage, false);
	const VkImageSubresourceRange		imageSubresourceRange	= makeColorSubresourceRange(0u, imageLayers);
	const MovePtr<Allocation>			imageAlloc				= bindImage(vk, device, allocator, *image, MemoryRequirement::Any);
	const Move<VkImageView>				imageView				= makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, COLOR_FORMAT, imageSubresourceRange);

	// Create a buffer where we will copy the image for verification
	const VkDeviceSize					colorBufferSize		= imageWidth * imageHeight * imageDepth * numSamples * tcu::getPixelSize(mapVkFormat(COLOR_FORMAT));
	const Unique<VkBuffer>				colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>			colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	// Create pipeline descriptor set for the image
	const Move<VkDescriptorSetLayout>	descriptorSetLayout		= DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_FRAGMENT_BIT)
		.build(vk, device);

	const Move<VkDescriptorPool>		descriptorPool			= DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 1)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1);

	const Move<VkDescriptorSet>			descriptorSet			= makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout);
	const VkDescriptorImageInfo			descriptorImageInfo		= makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.update(vk, device);

	const Unique<VkPipelineLayout>		pipelineLayout			(makePipelineLayout (vk, device, *descriptorSetLayout));
	vector<SharedPtrVkPipeline>			pipeline;
	const Unique<VkRenderPass>			renderPass				(makeRenderPassNoAtt (vk, device));
	Move<VkFramebuffer>					framebuffer;

	const Unique<VkCommandPool>			cmdPool					(createCommandPool (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>		cmdBuffer				(makeCommandBuffer (vk, device, *cmdPool));

	// create vertexBuffer
	{
		const vector<tcu::Vec4>	vertices			= genPointVertices();
		const VkDeviceSize		vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// Create render pass and pipeline
	pipeline.push_back(makeSharedPtr(makeGraphicsPipeline(vk, device, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
		renderSize, VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0, false, multisample)));
	framebuffer = makeFramebuffer(vk, device, *renderPass, 0, DE_NULL, renderSize.x(), renderSize.y());

	// Record command buffer
	beginCommandBuffer(vk, *cmdBuffer);
	{
		// shader image layout transition undefined -> general
		{
			const VkImageMemoryBarrier setImageLayoutBarrier = makeImageMemoryBarrier(
				0u, VK_ACCESS_SHADER_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
				*image, imageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0,
				0, DE_NULL, 0, DE_NULL, 1, &setImageLayoutBarrier);
		}

		// Render pass
		{
			const VkRect2D renderArea =
			{
				makeOffset2D(0, 0),
				makeExtent2D(renderSize.x(), renderSize.y()),
			};
			const VkRenderPassBeginInfo renderPassBeginInfo =
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				0,											// uint32_t                clearValueCount;
				DE_NULL,									// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize vertexBufferOffset = 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipeline[0]);
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout.get(), 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
			vk.cmdDraw(*cmdBuffer, 4u, 1u, 0u, 0u);

			vk.cmdEndRenderPass(*cmdBuffer);
		}

		// copy image to host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]		=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
					DE_NULL,									// const void*				pNext;
					VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_GENERAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
					*image,										// VkImage					image;
					makeColorSubresourceRange(0, 1)				// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageBarriers);

			const VkBufferImageCopy		region				=
			{
				0ull,																// VkDeviceSize                bufferOffset;
				0u,																	// uint32_t                    bufferRowLength;
				0u,																	// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1),	// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),												// VkOffset3D                  imageOffset;
				makeExtent3D(IVec3(imageWidth, imageHeight, imageDepth)),			// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}
	} // beginCommandBuffer

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
		const tcu::TextureFormat			format			= mapVkFormat(COLOR_FORMAT);
		tcu::TextureLevel					textureLevel	(format, imageWidth, imageHeight, imageDepth);
		const tcu::PixelBufferAccess		expectedImage	= getExpectedDataNoAtt(textureLevel);
		const tcu::ConstPixelBufferAccess	resultImage		(format, imageWidth, imageHeight, imageDepth, colorBufferAlloc->getHostPtr());

		if (!tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(1), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Fail");
	}

	return tcu::TestStatus::pass("Pass");
}